

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall QDockAreaLayoutInfo::sizeHint(QDockAreaLayoutInfo *this)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  qsizetype qVar6;
  const_reference pQVar7;
  int *piVar8;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  bool gap;
  QDockAreaLayoutItem *item;
  int i;
  QDockAreaLayoutItem *previous;
  QSize tbh;
  QSize size_hint;
  int max_perp;
  int min_perp;
  int b;
  int a;
  QSize result;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Orientation in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int local_a8;
  int local_a4;
  int local_74;
  const_reference local_70;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  QSize local_50;
  int local_48;
  int local_44;
  QSize local_40;
  int local_38;
  QSize local_34;
  int local_2c;
  QSize local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = isEmpty((QDockAreaLayoutInfo *)0x56d1b0);
  if (bVar3) {
    QSize::QSize((QSize *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    goto LAB_0056d6db;
  }
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_20 = 0xffffff;
  local_70 = (const_reference)0x0;
  for (local_74 = 0;
      qVar6 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 8)),
      local_74 < qVar6; local_74 = local_74 + 1) {
    pQVar7 = QList<QDockAreaLayoutItem>::at
                       ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffff30,
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar3 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar3) {
      bVar3 = (pQVar7->flags & 1) == 0;
      local_28 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QDockAreaLayoutItem::sizeHint
                           ((QDockAreaLayoutItem *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_34 = QDockAreaLayoutItem::minimumSize
                           ((QDockAreaLayoutItem *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_2c = perp((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      piVar8 = qMax<int>(&local_1c,&local_2c);
      local_1c = *piVar8;
      local_40 = QDockAreaLayoutItem::maximumSize
                           ((QDockAreaLayoutItem *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_38 = perp((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      piVar8 = qMin<int>(&local_20,&local_38);
      local_20 = *piVar8;
      if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
        if ((((local_70 != (const_reference)0x0) && (bVar3)) && ((local_70->flags & 1) == 0)) &&
           (bVar4 = QDockAreaLayoutItem::hasFixedSize
                              ((QDockAreaLayoutItem *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               in_stack_ffffffffffffff44), !bVar4)) {
          local_14 = *(int *)*in_RDI + local_14;
        }
        if (bVar3) {
          local_a8 = pick((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                          (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
        else {
          local_a8 = pQVar7->size;
        }
        local_14 = local_a8 + local_14;
      }
      else {
        if (bVar3) {
          local_a4 = pick((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                          (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
        else {
          local_a4 = pQVar7->size;
        }
        local_44 = local_a4;
        piVar8 = qMax<int>(&local_14,&local_44);
        local_14 = *piVar8;
      }
      local_48 = perp((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      piVar8 = qMax<int>(&local_18,&local_48);
      local_18 = *piVar8;
      local_70 = pQVar7;
    }
  }
  piVar8 = qMax<int>(&local_20,&local_1c);
  local_20 = *piVar8;
  piVar8 = qMax<int>(&local_18,&local_1c);
  local_18 = *piVar8;
  piVar8 = qMin<int>(&local_18,&local_20);
  local_18 = *piVar8;
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_ffffffffffffff30);
  iVar2 = local_14;
  piVar8 = rpick((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar5 = local_18;
  *piVar8 = iVar2;
  piVar8 = rperp((Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *piVar8 = iVar5;
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) goto LAB_0056d6db;
  local_50 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = tabBarSizeHint(in_stack_ffffffffffffff30);
  uVar1 = *(uint *)(in_RDI + 0xd);
  if (uVar1 < 2) {
LAB_0056d5e5:
    iVar5 = QSize::height((QSize *)0x56d5f2);
    piVar8 = QSize::rheight((QSize *)0x56d603);
    *piVar8 = iVar5 + *piVar8;
    local_54 = QSize::width((QSize *)0x56d618);
    local_58 = QSize::width((QSize *)0x56d62c);
    piVar8 = qMax<int>(&local_54,&local_58);
    iVar5 = *piVar8;
    piVar8 = QSize::rwidth((QSize *)0x56d65b);
    *piVar8 = iVar5;
  }
  else {
    if (1 < uVar1 - 2) {
      if (uVar1 - 4 < 2) goto LAB_0056d5e5;
      if (1 < uVar1 - 6) goto LAB_0056d6db;
    }
    local_5c = QSize::height((QSize *)0x56d670);
    local_60 = QSize::height((QSize *)0x56d681);
    piVar8 = qMax<int>(&local_5c,&local_60);
    iVar5 = *piVar8;
    piVar8 = QSize::rheight((QSize *)0x56d6a7);
    *piVar8 = iVar5;
    iVar5 = QSize::width((QSize *)0x56d6ba);
    piVar8 = QSize::rwidth((QSize *)0x56d6cb);
    *piVar8 = iVar5 + *piVar8;
  }
LAB_0056d6db:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QDockAreaLayoutInfo::sizeHint() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    int min_perp = 0;
    int max_perp = QWIDGETSIZE_MAX;
    const QDockAreaLayoutItem *previous = nullptr;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        bool gap = item.flags & QDockAreaLayoutItem::GapItem;

        QSize size_hint = item.sizeHint();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));
        max_perp = qMin(max_perp, perp(o, item.maximumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, gap ? item.size : pick(o, size_hint));
        } else
#endif
        {
            if (previous && !gap && !(previous->flags &  QDockAreaLayoutItem::GapItem)
                && !previous->hasFixedSize(o)) {
                a += *sep;
            }
            a += gap ? item.size : pick(o, size_hint);
        }
        b = qMax(b, perp(o, size_hint));

        previous = &item;
    }

    max_perp = qMax(max_perp, min_perp);
    b = qMax(b, min_perp);
    b = qMin(b, max_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QSize tbh = tabBarSizeHint();
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbh.height();
                result.rwidth() = qMax(tbh.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbh.height(), result.height());
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}